

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

NODE * update_node(char *relname,NODE *relattr,NODE *relorvalue,NODE *conditionlist)

{
  NODE *pNVar1;
  
  pNVar1 = newnode(N_UPDATE);
  (pNVar1->u).CREATETABLE.relname = relname;
  (pNVar1->u).CREATETABLE.attrlist = relattr;
  (pNVar1->u).QUERY.conditionlist = relorvalue;
  (pNVar1->u).UPDATE.conditionlist = conditionlist;
  return pNVar1;
}

Assistant:

NODE *update_node(char *relname, NODE *relattr, NODE *relorvalue, 
		  NODE *conditionlist)
{
    NODE *n = newnode(N_UPDATE);

    n->u.UPDATE.relname = relname;
    n->u.UPDATE.relattr = relattr;
    n->u.UPDATE.relorvalue = relorvalue;
    n->u.UPDATE.conditionlist = conditionlist;
    return n;
}